

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O3

TimingControl *
slang::ast::EventListControl::fromSyntax
          (Compilation *compilation,SyntaxNode *syntax,ASTContext *context)

{
  int iVar1;
  undefined4 extraout_var;
  EventListControl *pEVar2;
  long lVar3;
  EVP_PKEY_CTX *src;
  SmallVector<slang::ast::TimingControl_*,_5UL> events;
  span<const_slang::ast::TimingControl_*const,_18446744073709551615UL> local_78;
  SmallVectorBase<slang::ast::TimingControl_*> local_68 [2];
  SourceRange local_28;
  
  local_68[0].len = 0;
  local_68[0].cap = 5;
  local_68[0].data_ = (pointer)local_68[0].firstElement;
  collectEvents(context,syntax,local_68);
  if (local_68[0].len == 1) {
    pEVar2 = (EventListControl *)*local_68[0].data_;
  }
  else {
    iVar1 = SmallVectorBase<slang::ast::TimingControl_*>::copy
                      (local_68,(EVP_PKEY_CTX *)compilation,src);
    local_78._M_ptr = (pointer)CONCAT44(extraout_var,iVar1);
    local_28 = slang::syntax::SyntaxNode::sourceRange(syntax);
    pEVar2 = BumpAllocator::
             emplace<slang::ast::EventListControl,std::span<slang::ast::TimingControl_const*const,18446744073709551615ul>,slang::SourceRange>
                       (&compilation->super_BumpAllocator,&local_78,&local_28);
    if (local_68[0].len != 0) {
      lVar3 = 0;
      do {
        if (**(int **)((long)local_68[0].data_ + lVar3) == 0) {
          local_78._M_ptr = (pointer)pEVar2;
          pEVar2 = (EventListControl *)
                   BumpAllocator::
                   emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
                             (&compilation->super_BumpAllocator,(TimingControl **)&local_78);
          break;
        }
        lVar3 = lVar3 + 8;
      } while (local_68[0].len << 3 != lVar3);
    }
  }
  if (local_68[0].data_ != (pointer)local_68[0].firstElement) {
    operator_delete(local_68[0].data_);
  }
  return &pEVar2->super_TimingControl;
}

Assistant:

TimingControl& EventListControl::fromSyntax(Compilation& compilation, const SyntaxNode& syntax,
                                            const ASTContext& context) {
    SmallVector<TimingControl*> events;
    collectEvents(context, syntax, events);

    if (events.size() == 1)
        return *events[0];

    auto result = compilation.emplace<EventListControl>(events.ccopy(compilation),
                                                        syntax.sourceRange());
    for (auto ev : events) {
        if (ev->bad())
            return badCtrl(compilation, result);
    }

    return *result;
}